

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,float value_step)

{
  nk_style_slider *pnVar1;
  nk_image *img;
  float fVar2;
  nk_vec2 nVar3;
  nk_color c;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  undefined1 auVar7 [12];
  nk_widget_layout_states nVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  nk_style_slider *pnVar12;
  nk_context *in;
  long lVar13;
  int *piVar14;
  nk_command_buffer *out;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar24;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect b;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect r;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  nk_rect rect_05;
  nk_rect r_00;
  nk_rect r_01;
  long lStackY_160;
  float local_14c;
  undefined8 local_e8;
  undefined8 local_b8;
  nk_flags local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  nk_rect bounds;
  undefined1 auVar22 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x51f3,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x51f4,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x51f5,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (value == (float *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x51f6,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  nVar8 = nk_widget(&bounds,ctx);
  if (nVar8 == NK_WIDGET_INVALID) {
    return 0;
  }
  in = (nk_context *)0x0;
  if ((pnVar5->flags & 0x1000) == 0) {
    in = ctx;
  }
  fVar2 = *value;
  out = &pnVar4->buffer;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = bounds.w;
  auVar23._4_4_ = bounds.h;
  fVar25 = (ctx->style).slider.cursor_size.x;
  nVar3 = (ctx->style).slider.padding;
  fVar15 = nVar3.x;
  fVar24 = nVar3.y;
  bounds_00.x = bounds.x + fVar15;
  bounds_00.y = bounds.y + fVar24;
  auVar21._0_4_ = fVar15 + fVar15 + fVar25;
  auVar7._4_8_ = (ulong)nVar3 >> 0x20;
  auVar7._0_4_ = auVar21._0_4_;
  auVar22._0_8_ = auVar7._0_8_;
  auVar22._8_4_ = fVar24;
  auVar22._12_4_ = fVar24;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._4_4_ = fVar24 + fVar24;
  auVar23 = maxps(auVar21,auVar23);
  fVar20 = auVar23._0_4_ - (fVar15 + fVar15);
  fVar24 = auVar23._4_4_ - (fVar24 + fVar24);
  fVar15 = fVar2;
  if ((ctx->style).slider.show_buttons != 0) {
    font = (ctx->style).font;
    bounds_00.h = fVar24;
    bounds_00.w = fVar24;
    iVar9 = nk_do_button_symbol(&local_8c,out,bounds_00,(ctx->style).slider.dec_symbol,
                                NK_BUTTON_DEFAULT,&(ctx->style).slider.dec_button,&in->input,font);
    if (iVar9 != 0) {
      fVar15 = fVar2 - value_step;
    }
    bounds_01.y = bounds_00.y;
    bounds_01.x = (bounds_00.x + fVar20) - fVar24;
    bounds_01.w = fVar24;
    bounds_01.h = fVar24;
    iVar9 = nk_do_button_symbol(&local_8c,out,bounds_01,(ctx->style).slider.inc_symbol,
                                NK_BUTTON_DEFAULT,&(ctx->style).slider.inc_button,&in->input,font);
    if (iVar9 != 0) {
      fVar15 = fVar15 + value_step;
    }
    fVar25 = (ctx->style).slider.spacing.x;
    bounds_00.x = bounds_00.x + fVar24 + fVar25;
    fVar20 = fVar20 - (fVar24 + fVar24 + fVar25 + fVar25);
    fVar25 = (ctx->style).slider.cursor_size.x;
  }
  fVar26 = fVar25 * 0.5;
  fVar16 = fVar26 + bounds_00.x;
  rect.x = bounds_00.x + fVar26;
  rect.w = fVar20 - fVar25;
  bounds_00.x = min_value;
  if (max_value <= min_value) {
    bounds_00.x = max_value;
    max_value = min_value;
  }
  if (max_value <= fVar15) {
    fVar15 = max_value;
  }
  local_14c = bounds_00.x;
  if (bounds_00.x <= fVar15) {
    local_14c = fVar15;
  }
  fVar19 = (fVar20 - fVar25) / ((max_value - bounds_00.x) / value_step);
  fVar15 = (ctx->style).slider.cursor_size.y;
  local_88._0_4_ = ((local_14c - bounds_00.x) / value_step) * fVar19 + rect.x;
  local_88._4_4_ = fVar24 * 0.5 + bounds_00.y;
  fStack_80 = (auVar23._8_4_ - 0.0) * 0.0 + 0.0;
  fStack_7c = (auVar23._12_4_ - 0.0) * 0.0 + 0.0;
  fVar17 = fVar25 * -0.5 + (float)local_88._0_4_;
  fVar18 = fVar15 * -0.5 + (float)local_88._4_4_;
  uVar11 = ctx->last_widget_state & 2 | 4;
  ctx->last_widget_state = uVar11;
  r_01.h = fVar15;
  r_01.w = fVar25;
  if (((in != (nk_context *)0x0) &&
      (iVar9 = (in->input).mouse.buttons[0].down, b.y = fVar18, b.x = fVar17, b.h = fVar15,
      b.w = fVar25, iVar10 = nk_input_has_mouse_click_down_in_rect(&in->input,NK_BUTTON_LEFT,b,1),
      iVar9 != 0)) && (iVar10 != 0)) {
    fVar17 = (in->input).mouse.pos.x - (fVar26 + fVar17);
    ctx->last_widget_state = 0x22;
    fVar26 = -fVar17;
    if (-fVar17 <= fVar17) {
      fVar26 = fVar17;
    }
    uVar11 = 0x22;
    if (fVar19 <= fVar26) {
      fVar26 = local_14c +
               (float)(~-(uint)(0.0 < fVar17) & (uint)-(float)(int)(fVar26 / fVar19) |
                      (uint)(float)(int)(fVar26 / fVar19) & -(uint)(0.0 < fVar17)) * value_step;
      if (max_value <= fVar26) {
        fVar26 = max_value;
      }
      local_14c = bounds_00.x;
      if (bounds_00.x <= fVar26) {
        local_14c = fVar26;
      }
      bounds_00.x = ((local_14c - bounds_00.x) / value_step) * fVar19 + fVar16;
      _local_88 = ZEXT416((uint)bounds_00.x);
      (in->input).mouse.buttons[0].clicked_pos.x = bounds_00.x;
    }
  }
  rect.y = bounds_00.y;
  rect.h = fVar24;
  iVar9 = nk_input_is_mouse_hovering_rect(&in->input,rect);
  rect_00.y = bounds_00.y;
  rect_00.x = rect.x;
  rect_00.h = fVar24;
  rect_00.w = rect.w;
  if (iVar9 == 0) {
LAB_0013694e:
    rect_01.y = bounds_00.y;
    rect_01.x = rect.x;
    rect_01.h = fVar24;
    rect_01.w = rect.w;
    iVar9 = nk_input_is_mouse_prev_hovering_rect(&in->input,rect_01);
    if (iVar9 == 0) goto LAB_00136999;
    uVar11 = uVar11 | 0x40;
  }
  else {
    ctx->last_widget_state = 0x12;
    iVar9 = nk_input_is_mouse_prev_hovering_rect(&in->input,rect_00);
    if (iVar9 != 0) {
      uVar11 = 0x12;
      goto LAB_0013694e;
    }
    uVar11 = 0x1a;
  }
  ctx->last_widget_state = uVar11;
LAB_00136999:
  p_Var6 = (ctx->style).slider.draw_begin;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
    uVar11 = ctx->last_widget_state;
  }
  bounds_00.x = -fVar25 * 0.5 + (float)local_88._0_4_;
  pnVar1 = &(ctx->style).slider;
  if ((uVar11 & 0x20) == 0) {
    if ((uVar11 & 0x10) == 0) {
      lVar13 = 0x78;
      lStackY_160 = 100;
      pnVar12 = pnVar1;
    }
    else {
      pnVar12 = (nk_style_slider *)&(ctx->style).slider.hover;
      lVar13 = 0x98;
      lStackY_160 = 0x68;
    }
  }
  else {
    pnVar12 = (nk_style_slider *)&(ctx->style).slider.active;
    lVar13 = 0xb8;
    lStackY_160 = 0x6c;
  }
  piVar14 = (int *)((long)&(pnVar1->normal).type + lVar13);
  c = *(nk_color *)((long)&(pnVar1->normal).type + lStackY_160);
  fVar26 = fVar24 / -12.0 + fVar18 + fVar15 * 0.5;
  if ((pnVar12->normal).type == NK_STYLE_ITEM_IMAGE) {
    r.h = fVar24;
    r.w = rect.w;
    r.y = bounds_00.y;
    r.x = rect.x;
    nk_draw_image(out,r,&(pnVar12->normal).data.image,(nk_color)0xffffffff);
  }
  else {
    rect_02.h = fVar24;
    rect_02.w = rect.w;
    rect_02.y = bounds_00.y;
    rect_02.x = rect.x;
    nk_fill_rect(out,rect_02,(ctx->style).slider.rounding,(pnVar12->normal).data.color);
    rect_03.y = bounds_00.y;
    rect_03.x = rect.x;
    rect_03.h = fVar24;
    rect_03.w = rect.w;
    nk_stroke_rect(out,rect_03,(ctx->style).slider.rounding,(ctx->style).slider.border,
                   (ctx->style).slider.border_color);
  }
  rect_04.h = fVar24 / 6.0;
  rect_04.w = fVar20 - fVar25;
  rect_04.x = fVar16;
  rect_04.y = fVar26;
  nk_fill_rect(out,rect_04,(ctx->style).slider.rounding,c);
  rect_05.w = (fVar25 * 0.5 + bounds_00.x) - fVar16;
  rect_05.h = fVar24 / 6.0;
  rect_05.x = fVar16;
  rect_05.y = fVar26;
  nk_fill_rect(out,rect_05,(ctx->style).slider.rounding,(ctx->style).slider.bar_filled);
  img = (nk_image *)(piVar14 + 2);
  if (*piVar14 == 1) {
    r_00.y = fVar18;
    r_00.x = bounds_00.x;
    r_00.w = fVar25;
    r_00.h = fVar15;
    nk_draw_image(out,r_00,img,(nk_color)0xffffffff);
  }
  else {
    r_01.y = fVar18;
    r_01.x = bounds_00.x;
    nk_fill_circle(out,r_01,(nk_color)(img->handle).id);
  }
  p_Var6 = (ctx->style).slider.draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
  }
  *value = local_14c;
  return (uint)(fVar2 != local_14c);
}

Assistant:

NK_API int
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
    float value_step)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    int ret = 0;
    float old_value;
    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(value);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return ret;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return ret;
    in = (/*state == NK_WIDGET_ROM || */ layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    old_value = *value;
    *value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
                old_value, max_value, value_step, &style->slider, in, style->font);
    return (old_value > *value || old_value < *value);
}